

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int build_esni_contents_hash
              (ptls_hash_algorithm_t *hash,uint8_t *digest,uint8_t *record_digest,uint16_t group,
              ptls_iovec_t pubkey,uint8_t *client_random)

{
  size_t body_size;
  size_t body_start;
  size_t capacity;
  undefined1 local_158 [4];
  int ret;
  uint8_t smallbuf [256];
  ptls_buffer_t buf;
  uint16_t group_local;
  uint8_t *record_digest_local;
  uint8_t *digest_local;
  ptls_hash_algorithm_t *hash_local;
  ptls_iovec_t pubkey_local;
  
  ptls_buffer_init((ptls_buffer_t *)(smallbuf + 0xf8),local_158,0x100);
  body_start = 2;
  capacity._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)(smallbuf + 0xf8),"",2);
  if ((capacity._4_4_ == 0) &&
     (capacity._4_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)(smallbuf + 0xf8),record_digest,hash->digest_size)
     , capacity._4_4_ == 0)) {
    for (; body_start != 0; body_start = body_start - 1) {
      *(char *)(smallbuf._248_8_ + (buf.capacity - body_start)) =
           (char)(0L >> (((char)body_start + -1) * '\b' & 0x3fU));
    }
    capacity._4_4_ = push_key_share_entry((ptls_buffer_t *)(smallbuf + 0xf8),group,pubkey);
    if (((capacity._4_4_ == 0) &&
        (capacity._4_4_ =
              ptls_buffer__do_pushv((ptls_buffer_t *)(smallbuf + 0xf8),client_random,0x20),
        capacity._4_4_ == 0)) &&
       (capacity._4_4_ = ptls_calc_hash(hash,digest,(void *)smallbuf._248_8_,buf.capacity),
       capacity._4_4_ == 0)) {
      capacity._4_4_ = 0;
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)(smallbuf + 0xf8));
  return capacity._4_4_;
}

Assistant:

static int build_esni_contents_hash(ptls_hash_algorithm_t *hash, uint8_t *digest, const uint8_t *record_digest, uint16_t group,
                                    ptls_iovec_t pubkey, const uint8_t *client_random)
{
    ptls_buffer_t buf;
    uint8_t smallbuf[256];
    int ret;

    /* build ESNIContents */
    ptls_buffer_init(&buf, smallbuf, sizeof(smallbuf));
    ptls_buffer_push_block(&buf, 2, { ptls_buffer_pushv(&buf, record_digest, hash->digest_size); });
    if ((ret = push_key_share_entry(&buf, group, pubkey)) != 0)
        goto Exit;
    ptls_buffer_pushv(&buf, client_random, PTLS_HELLO_RANDOM_SIZE);

    /* calculate digest */
    if ((ret = ptls_calc_hash(hash, digest, buf.base, buf.off)) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&buf);
    return ret;
}